

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binning.cpp
# Opt level: O1

ScalarFunctionSet * duckdb::EquiWidthBinsFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_true> *this;
  pointer pSVar1;
  LogicalType varargs;
  LogicalType varargs_00;
  LogicalType varargs_01;
  LogicalType varargs_02;
  ScalarFunctionSet *pSVar2;
  ScalarFunctionSet *in_RDI;
  long lVar3;
  ScalarFunction *function;
  pointer function_00;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  initializer_list<duckdb::LogicalType> __l_01;
  initializer_list<duckdb::LogicalType> __l_02;
  undefined4 in_stack_fffffffffffff7e4;
  undefined4 in_stack_fffffffffffff7ec;
  FunctionNullHandling in_stack_fffffffffffff7f8;
  bind_lambda_function_t in_stack_fffffffffffff800;
  LogicalType local_7f8;
  ScalarFunctionSet *local_7e0;
  scalar_function_t local_7d8;
  scalar_function_t local_7b8;
  scalar_function_t local_798;
  scalar_function_t local_778;
  LogicalType local_750 [4];
  LogicalType local_6f0;
  LogicalType local_6d8;
  LogicalType local_6c0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_6a8;
  LogicalType local_690;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_678;
  LogicalType local_660;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_648;
  LogicalType local_630;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_618;
  LogicalType local_600;
  LogicalType local_5e8;
  LogicalType local_5d0;
  LogicalType local_5b8;
  string local_5a0;
  ScalarFunction local_580;
  ScalarFunction local_458;
  ScalarFunction local_330;
  ScalarFunction local_208;
  BaseScalarFunction local_e0;
  
  local_5a0._M_dataplus._M_p = (pointer)&local_5a0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a0,"equi_width_bins","");
  ScalarFunctionSet::ScalarFunctionSet(in_RDI,&local_5a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
    operator_delete(local_5a0._M_dataplus._M_p);
  }
  local_7e0 = in_RDI;
  LogicalType::LogicalType(local_750,BIGINT);
  LogicalType::LogicalType(local_750 + 1,BIGINT);
  LogicalType::LogicalType(local_750 + 2,BIGINT);
  LogicalType::LogicalType(local_750 + 3,BOOLEAN);
  __l._M_len = 4;
  __l._M_array = local_750;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_618,__l,(allocator_type *)&stack0xfffffffffffff807);
  LogicalType::LogicalType(&local_7f8,ANY);
  LogicalType::LIST(&local_630,&local_7f8);
  local_778.super__Function_base._M_functor._8_8_ = 0;
  local_778.super__Function_base._M_functor._M_unused._M_object =
       EquiWidthBinFunction<long,duckdb::EquiWidthBinsInteger>;
  local_778._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_778.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_5b8,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_5b8;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_fffffffffffff7e4;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_fffffffffffff7ec;
  ScalarFunction::ScalarFunction
            (&local_208,(vector<duckdb::LogicalType,_true> *)&local_618,&local_630,&local_778,
             BindEquiWidthFunction,(bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
             (init_local_state_t)0x0,varargs,CONSISTENT,in_stack_fffffffffffff7f8,
             in_stack_fffffffffffff800);
  this = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_208);
  local_208.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01993078;
  if (local_208.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_208.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_208.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_208.function.super__Function_base._M_manager)
              ((_Any_data *)&local_208.function,(_Any_data *)&local_208.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_208.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_5b8);
  if (local_778.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_778.super__Function_base._M_manager)
              ((_Any_data *)&local_778,(_Any_data *)&local_778,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_630);
  LogicalType::~LogicalType(&local_7f8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_618);
  lVar3 = 0x48;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_750[0].id_ + lVar3));
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  LogicalType::LogicalType(local_750,DOUBLE);
  LogicalType::LogicalType(local_750 + 1,DOUBLE);
  LogicalType::LogicalType(local_750 + 2,BIGINT);
  LogicalType::LogicalType(local_750 + 3,BOOLEAN);
  __l_00._M_len = 4;
  __l_00._M_array = local_750;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_648,__l_00,(allocator_type *)&stack0xfffffffffffff807);
  LogicalType::LogicalType(&local_7f8,ANY);
  LogicalType::LIST(&local_660,&local_7f8);
  local_798.super__Function_base._M_functor._8_8_ = 0;
  local_798.super__Function_base._M_functor._M_unused._M_object =
       EquiWidthBinFunction<double,duckdb::EquiWidthBinsDouble>;
  local_798._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_798.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_5d0,INVALID);
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_00._0_8_ = &local_5d0;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffff7e4;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffff7ec;
  ScalarFunction::ScalarFunction
            (&local_330,(vector<duckdb::LogicalType,_true> *)&local_648,&local_660,&local_798,
             BindEquiWidthFunction,(bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
             (init_local_state_t)0x0,varargs_00,CONSISTENT,in_stack_fffffffffffff7f8,
             in_stack_fffffffffffff800);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_330);
  local_330.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01993078;
  if (local_330.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_330.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_330.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_330.function.super__Function_base._M_manager)
              ((_Any_data *)&local_330.function,(_Any_data *)&local_330.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_330.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_5d0);
  if (local_798.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_798.super__Function_base._M_manager)
              ((_Any_data *)&local_798,(_Any_data *)&local_798,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_660);
  LogicalType::~LogicalType(&local_7f8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_648);
  lVar3 = 0x48;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_750[0].id_ + lVar3));
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  LogicalType::LogicalType(local_750,TIMESTAMP);
  LogicalType::LogicalType(local_750 + 1,TIMESTAMP);
  LogicalType::LogicalType(local_750 + 2,BIGINT);
  LogicalType::LogicalType(local_750 + 3,BOOLEAN);
  __l_01._M_len = 4;
  __l_01._M_array = local_750;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_678,__l_01,(allocator_type *)&stack0xfffffffffffff807);
  LogicalType::LogicalType(&local_7f8,ANY);
  LogicalType::LIST(&local_690,&local_7f8);
  local_7b8.super__Function_base._M_functor._8_8_ = 0;
  local_7b8.super__Function_base._M_functor._M_unused._M_object =
       EquiWidthBinFunction<duckdb::timestamp_t,duckdb::EquiWidthBinsTimestamp>;
  local_7b8._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_7b8.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_5e8,INVALID);
  varargs_01.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_01._0_8_ = &local_5e8;
  varargs_01.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffff7e4;
  varargs_01.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_01.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffff7ec;
  ScalarFunction::ScalarFunction
            (&local_458,(vector<duckdb::LogicalType,_true> *)&local_678,&local_690,&local_7b8,
             BindEquiWidthFunction,(bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
             (init_local_state_t)0x0,varargs_01,CONSISTENT,in_stack_fffffffffffff7f8,
             in_stack_fffffffffffff800);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_458);
  local_458.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01993078;
  if (local_458.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_458.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_458.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_458.function.super__Function_base._M_manager)
              ((_Any_data *)&local_458.function,(_Any_data *)&local_458.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_458.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_5e8);
  if (local_7b8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_7b8.super__Function_base._M_manager)
              ((_Any_data *)&local_7b8,(_Any_data *)&local_7b8,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_690);
  LogicalType::~LogicalType(&local_7f8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_678);
  lVar3 = 0x48;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_750[0].id_ + lVar3));
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  LogicalType::LogicalType(&local_6c0,ANY);
  LogicalType::ANY_PARAMS(local_750,&local_6c0,0x96);
  LogicalType::LogicalType(&local_6d8,ANY);
  LogicalType::ANY_PARAMS(local_750 + 1,&local_6d8,0x96);
  LogicalType::LogicalType(local_750 + 2,BIGINT);
  LogicalType::LogicalType(local_750 + 3,BOOLEAN);
  __l_02._M_len = 4;
  __l_02._M_array = local_750;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_6a8,__l_02,(allocator_type *)&stack0xfffffffffffff807);
  LogicalType::LogicalType(&local_7f8,ANY);
  LogicalType::LIST(&local_6f0,&local_7f8);
  local_7d8.super__Function_base._M_functor._8_8_ = 0;
  local_7d8.super__Function_base._M_functor._M_unused._M_object = UnsupportedEquiWidth;
  local_7d8._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_7d8.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_600,INVALID);
  varargs_02.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_02._0_8_ = &local_600;
  varargs_02.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffff7e4;
  varargs_02.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_02.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffff7ec;
  ScalarFunction::ScalarFunction
            (&local_580,(vector<duckdb::LogicalType,_true> *)&local_6a8,&local_6f0,&local_7d8,
             BindEquiWidthFunction,(bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
             (init_local_state_t)0x0,varargs_02,CONSISTENT,in_stack_fffffffffffff7f8,
             in_stack_fffffffffffff800);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_580);
  local_580.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01993078;
  if (local_580.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_580.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  pSVar2 = local_7e0;
  if (local_580.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_580.function.super__Function_base._M_manager)
              ((_Any_data *)&local_580.function,(_Any_data *)&local_580.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_580.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_600);
  if (local_7d8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_7d8.super__Function_base._M_manager)
              ((_Any_data *)&local_7d8,(_Any_data *)&local_7d8,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_6f0);
  LogicalType::~LogicalType(&local_7f8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_6a8);
  lVar3 = 0x48;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_750[0].id_ + lVar3));
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  LogicalType::~LogicalType(&local_6d8);
  LogicalType::~LogicalType(&local_6c0);
  function_00 = (pSVar2->super_FunctionSet<duckdb::ScalarFunction>).functions.
                super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
                super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
                _M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (pSVar2->super_FunctionSet<duckdb::ScalarFunction>).functions.
           super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (function_00 != pSVar1) {
    do {
      function_00->serialize = EquiWidthBinSerialize;
      function_00->deserialize = EquiWidthBinDeserialize;
      BaseScalarFunction::SetReturnsError(&local_e0,&function_00->super_BaseScalarFunction);
      BaseScalarFunction::~BaseScalarFunction(&local_e0);
      function_00 = function_00 + 1;
    } while (function_00 != pSVar1);
  }
  return local_7e0;
}

Assistant:

ScalarFunctionSet EquiWidthBinsFun::GetFunctions() {
	ScalarFunctionSet functions("equi_width_bins");
	functions.AddFunction(
	    ScalarFunction({LogicalType::BIGINT, LogicalType::BIGINT, LogicalType::BIGINT, LogicalType::BOOLEAN},
	                   LogicalType::LIST(LogicalType::ANY), EquiWidthBinFunction<int64_t, EquiWidthBinsInteger>,
	                   BindEquiWidthFunction));
	functions.AddFunction(ScalarFunction(
	    {LogicalType::DOUBLE, LogicalType::DOUBLE, LogicalType::BIGINT, LogicalType::BOOLEAN},
	    LogicalType::LIST(LogicalType::ANY), EquiWidthBinFunction<double, EquiWidthBinsDouble>, BindEquiWidthFunction));
	functions.AddFunction(
	    ScalarFunction({LogicalType::TIMESTAMP, LogicalType::TIMESTAMP, LogicalType::BIGINT, LogicalType::BOOLEAN},
	                   LogicalType::LIST(LogicalType::ANY), EquiWidthBinFunction<timestamp_t, EquiWidthBinsTimestamp>,
	                   BindEquiWidthFunction));
	functions.AddFunction(
	    ScalarFunction({LogicalType::ANY_PARAMS(LogicalType::ANY, 150), LogicalType::ANY_PARAMS(LogicalType::ANY, 150),
	                    LogicalType::BIGINT, LogicalType::BOOLEAN},
	                   LogicalType::LIST(LogicalType::ANY), UnsupportedEquiWidth, BindEquiWidthFunction));
	for (auto &function : functions.functions) {
		function.serialize = EquiWidthBinSerialize;
		function.deserialize = EquiWidthBinDeserialize;
		BaseScalarFunction::SetReturnsError(function);
	}
	return functions;
}